

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O1

Gia_StaAre_t * Gia_ManAreCreateStaNew(Gia_ManAre_t *p)

{
  int iVar1;
  uint **ppuVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  uint *puVar5;
  Gia_StaAre_t *pGVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  
  iVar7 = p->nStas;
  iVar8 = p->nStaPages;
  if (iVar7 == iVar8 << 0x14) {
    if (iVar8 == 0x800) {
      puts("ERA manager has run out of memory after allocating 2B state cubes.");
      pGVar6 = (Gia_StaAre_t *)0x0;
      goto LAB_006cea44;
    }
    ppuVar2 = p->ppStas;
    if (ppuVar2[iVar8] == (uint *)0x0) {
      puVar5 = (uint *)calloc((long)p->nSize << 0x14,4);
      ppuVar2[iVar8] = puVar5;
    }
    p->nStaPages = iVar8 + 1;
    if (iVar7 == 0) {
      p->nStas = 1;
    }
  }
  uVar10 = p->nStas;
  p->nStas = uVar10 + 1;
  pGVar6 = (Gia_StaAre_t *)
           ((long)p->nSize * (ulong)(uVar10 & 0xfffff) * 4 +
           *(long *)((long)p->ppStas + (ulong)(uVar10 >> 0x11 & 0x3ff8)));
LAB_006cea44:
  pGVar3 = p->pAig;
  iVar7 = pGVar3->nRegs;
  if (0 < iVar7) {
    pVVar4 = pGVar3->vCos;
    iVar8 = 0;
    iVar9 = 0;
    do {
      iVar1 = pVVar4->nSize;
      uVar10 = (iVar1 - iVar7) + iVar9;
      if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = pVVar4->pArray[uVar10];
      if (((long)iVar7 < 0) || (pGVar3->nObjs <= iVar7)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar3->pObjs == (Gia_Obj_t *)0x0) {
        return pGVar6;
      }
      uVar10 = pGVar3->pObjs[iVar7].Value;
      if (uVar10 == 0) {
        iVar7 = 1;
LAB_006ceab5:
        (&pGVar6[1].iPrev)[iVar8 >> 5] =
             (Gia_PtrAre_t)((uint)(&pGVar6[1].iPrev)[iVar8 >> 5] | iVar7 << ((byte)iVar8 & 0x1e));
      }
      else if (uVar10 == 1) {
        iVar7 = 2;
        goto LAB_006ceab5;
      }
      iVar9 = iVar9 + 1;
      iVar7 = pGVar3->nRegs;
      iVar8 = iVar8 + 2;
    } while (iVar9 < iVar7);
  }
  return pGVar6;
}

Assistant:

static inline Gia_StaAre_t * Gia_ManAreCreateStaNew( Gia_ManAre_t * p )
{
    Gia_StaAre_t * pSta;
    Gia_Obj_t * pObj;
    int i;
    pSta = Gia_ManAreCreateSta( p );
    Gia_ManForEachRi( p->pAig, pObj, i )
    {
        if ( pObj->Value == 0 )
            Gia_StaSetValue0( pSta, i );
        else if ( pObj->Value == 1 )
            Gia_StaSetValue1( pSta, i );
    }
    return pSta;
}